

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mpi_miller_rabin(mbedtls_mpi *X,size_t rounds,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                    void *p_rng)

{
  int iVar1;
  size_t count;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  mbedtls_mpi W;
  mbedtls_mpi A;
  mbedtls_mpi R;
  mbedtls_mpi RR;
  mbedtls_mpi T;
  
  W.s = 1;
  W.n = 0;
  W.p = (mbedtls_mpi_uint *)0x0;
  R.n = 0;
  R.p = (mbedtls_mpi_uint *)0x0;
  T.n = 0;
  T.p = (mbedtls_mpi_uint *)0x0;
  A.n = 0;
  A.p = (mbedtls_mpi_uint *)0x0;
  RR.n = 0;
  RR.p = (mbedtls_mpi_uint *)0x0;
  A.s = W.s;
  R.s = W.s;
  RR.s = W.s;
  T.s = W.s;
  iVar1 = mbedtls_mpi_sub_int(&W,X,1);
  if (iVar1 == 0) {
    count = mbedtls_mpi_lsb(&W);
    iVar1 = mbedtls_mpi_copy(&R,&W);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&R,count), iVar1 == 0)) {
      for (sVar4 = 0; iVar5 = 0x1f, iVar1 = 0, sVar4 != rounds; sVar4 = sVar4 + 1) {
        do {
          iVar1 = mbedtls_mpi_fill_random(&A,X->n << 3,f_rng,p_rng);
          if (iVar1 != 0) goto LAB_0010a7ed;
          sVar2 = mbedtls_mpi_bitlen(&A);
          sVar3 = mbedtls_mpi_bitlen(&W);
          if (sVar3 < sVar2) {
            A.p[A.n - 1] = A.p[A.n - 1] & ~(-1L << ((char)sVar3 - 1U & 0x3f));
          }
          bVar7 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          if (bVar7) goto LAB_0010a7e8;
          iVar1 = mbedtls_mpi_cmp_mpi(&A,&W);
        } while ((-1 < iVar1) || (iVar1 = mbedtls_mpi_cmp_int(&A,1), iVar1 < 1));
        iVar1 = mbedtls_mpi_exp_mod(&A,&A,&R,X,&RR);
        if (iVar1 != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi(&A,&W);
        if ((iVar1 != 0) && (iVar1 = mbedtls_mpi_cmp_int(&A,1), iVar1 != 0)) {
          uVar6 = 0;
          do {
            uVar6 = uVar6 + 1;
            if ((count <= uVar6) || (iVar1 = mbedtls_mpi_cmp_mpi(&A,&W), iVar1 == 0)) break;
            iVar1 = mbedtls_mpi_mul_mpi(&T,&A,&A);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(&A,&T,X), iVar1 != 0))
            goto LAB_0010a7ed;
            iVar1 = mbedtls_mpi_cmp_int(&A,1);
          } while (iVar1 != 0);
          iVar1 = mbedtls_mpi_cmp_mpi(&A,&W);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_cmp_int(&A,1), iVar1 == 0)) {
LAB_0010a7e8:
            iVar1 = -0xe;
            break;
          }
        }
      }
    }
  }
LAB_0010a7ed:
  mbedtls_mpi_free(&W);
  mbedtls_mpi_free(&R);
  mbedtls_mpi_free(&T);
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&RR);
  return iVar1;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X, size_t rounds,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, s;
    mbedtls_mpi W, R, T, A, RR;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R );
    mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    for( i = 0; i < rounds; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                A.p[A.n - 1] &= ( (mbedtls_mpi_uint) 1 << ( k - ( A.n - 1 ) * biL - 1 ) ) - 1;
            }

            if (count++ > 30) {
                ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
                goto cleanup;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R );
    mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}